

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Bool prvTidyFixDocType(TidyDocImpl *doc)

{
  Lexer *pLVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  AttVal *pAVar5;
  tmbstr ptVar6;
  Node *node;
  long lVar7;
  Node *pNVar8;
  ctmbstr ptVar9;
  int iVar10;
  bool bVar11;
  
  if (doc == (TidyDocImpl *)0x0) {
    node = (Node *)0x0;
  }
  else {
    node = (doc->root).content;
  }
  for (; (node != (Node *)0x0 && (node->type != DocTypeTag)); node = node->next) {
  }
  pLVar1 = doc->lexer;
  uVar2 = (doc->config).value[8].v;
  iVar10 = (int)uVar2;
  if ((iVar10 == 2 && node != (Node *)0x0) && (pLVar1->doctype == 0x60000)) {
    pLVar1->versionEmitted = 0x60000;
  }
  else {
    if (((iVar10 == 2) && (uVar3 = pLVar1->doctype, (pLVar1->versions & uVar3) != 0)) &&
       (((uVar3 & 0x41f00) == 0 || (pLVar1->isvoyager != no)))) {
      if (doc == (TidyDocImpl *)0x0) {
        pNVar8 = (Node *)0x0;
      }
      else {
        pNVar8 = (doc->root).content;
      }
      for (; pNVar8 != (Node *)0x0; pNVar8 = pNVar8->next) {
        if (pNVar8->type == DocTypeTag) goto LAB_00130047;
      }
    }
    if (iVar10 == 1) {
      if (node != (Node *)0x0) {
        prvTidyDiscardElement(doc,node);
      }
      uVar3 = prvTidyApparentVersion(doc);
LAB_00130047:
      pLVar1->versionEmitted = uVar3;
    }
    else if (*(int *)((doc->config).value + 0x19) == 0) {
      if (node == (Node *)0x0) {
        bVar11 = true;
      }
      else {
        pAVar5 = prvTidyGetAttrByName(node,"SYSTEM");
        bVar11 = pAVar5 == (AttVal *)0x0;
      }
      if (iVar10 - 3U < 2 && node != (Node *)0x0) {
        prvTidyDiscardElement(doc,node);
        node = (Node *)0x0;
      }
      uVar4 = 0;
      switch(uVar2 & 0xffffffff) {
      case 0:
        uVar4 = 0x20000;
        break;
      case 2:
        uVar4 = prvTidyHTMLVersion(doc);
        break;
      case 3:
        uVar4 = 0x20;
        break;
      case 4:
        uVar4 = 0x40;
      }
      pLVar1->versionEmitted = uVar4;
      if (uVar4 == 0) {
        return no;
      }
      if (node == (Node *)0x0) {
        node = NewDocTypeNode(doc);
        ptVar6 = prvTidytmbstrdup(doc->allocator,"html");
      }
      else {
        ptVar6 = prvTidytmbstrtolower(node->element);
      }
      node->element = ptVar6;
      lVar7 = 0x10;
      ptVar9 = (ctmbstr)0x0;
      do {
        if (*(uint *)(&UNK_0017c9d4 + lVar7) == uVar4) {
          ptVar9 = *(ctmbstr *)((long)&W3C_Doctypes[0].score + lVar7);
          break;
        }
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0x270);
      prvTidyRepairAttrValue(doc,node,"PUBLIC",ptVar9);
      if (!bVar11) {
        lVar7 = 0x18;
        ptVar9 = (ctmbstr)0x0;
        do {
          if (*(uint *)(&UNK_0017c9cc + lVar7) == uVar4) {
            ptVar9 = *(ctmbstr *)((long)&W3C_Doctypes[0].score + lVar7);
            break;
          }
          lVar7 = lVar7 + 0x20;
        } while (lVar7 != 0x278);
        prvTidyRepairAttrValue(doc,node,"SYSTEM",ptVar9);
      }
    }
  }
  return yes;
}

Assistant:

Bool TY_(FixDocType)( TidyDocImpl* doc )
{
    Lexer* lexer = doc->lexer;
    Node* doctype = TY_(FindDocType)( doc );
    uint dtmode = cfg( doc, TidyDoctypeMode );
    uint guessed = VERS_UNKNOWN;
    Bool hadSI = no;

    /* Issue #167 - found doctype, and doctype is default VERS_HTML5, set VERS_HTML5 and return yes */
    if (doctype && (dtmode == TidyDoctypeAuto) &&
        (lexer->doctype == VERS_HTML5) )
    {
        lexer->versionEmitted = lexer->doctype;
        return yes;
    }
    if (dtmode == TidyDoctypeAuto &&
        lexer->versions & lexer->doctype &&
        !(VERS_XHTML & lexer->doctype && !lexer->isvoyager)
        && TY_(FindDocType)(doc))
    {
        lexer->versionEmitted = lexer->doctype;
        return yes;
    }

    if (dtmode == TidyDoctypeOmit)
    {
        if (doctype)
            TY_(DiscardElement)( doc, doctype );
        lexer->versionEmitted = TY_(ApparentVersion)( doc );
        return yes;
    }

    if (cfgBool(doc, TidyXmlOut))
        return yes;

    if (doctype)
        hadSI = TY_(GetAttrByName)(doctype, "SYSTEM") != NULL;

    if ((dtmode == TidyDoctypeStrict ||
         dtmode == TidyDoctypeLoose) && doctype)
    {
        TY_(DiscardElement)(doc, doctype);
        doctype = NULL;
    }

    switch (dtmode)
    {
    case TidyDoctypeHtml5:
        guessed = HT50;
        break;
    case TidyDoctypeStrict:
        guessed = H41S;
        break;
    case TidyDoctypeLoose:
        guessed = H41T;
        break;
    case TidyDoctypeAuto:
        guessed = TY_(HTMLVersion)(doc);
        break;
    }

    lexer->versionEmitted = guessed;
    if (guessed == VERS_UNKNOWN)
        return no;

    if (doctype)
    {
        doctype->element = TY_(tmbstrtolower)(doctype->element);
    }
    else
    {
        doctype = NewDocTypeNode(doc);
        doctype->element = TY_(tmbstrdup)(doc->allocator, "html");
    }

    TY_(RepairAttrValue)(doc, doctype, "PUBLIC", GetFPIFromVers(guessed));

    if (hadSI)
        TY_(RepairAttrValue)(doc, doctype, "SYSTEM", GetSIFromVers(guessed));

    return yes;
}